

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::CapabilitiesEvent>::destruct
          (BasicTypeInfo<dap::CapabilitiesEvent> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::CapabilitiesEvent> *this_local;
  
  CapabilitiesEvent::~CapabilitiesEvent((CapabilitiesEvent *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }